

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setopt.c
# Opt level: O0

CURLcode setstropt_userpwd(char *option,char **userp,char **passwdp)

{
  size_t len;
  char **local_60;
  char **local_50;
  char *local_38;
  char *passwd;
  char *user;
  char **ppcStack_20;
  CURLcode result;
  char **passwdp_local;
  char **userp_local;
  char *option_local;
  
  user._4_4_ = CURLE_OK;
  passwd = (char *)0x0;
  local_38 = (char *)0x0;
  ppcStack_20 = passwdp;
  passwdp_local = userp;
  userp_local = (char **)option;
  if (option != (char *)0x0) {
    len = strlen(option);
    if (passwdp_local == (char **)0x0) {
      local_50 = (char **)0x0;
    }
    else {
      local_50 = &passwd;
    }
    if (ppcStack_20 == (char **)0x0) {
      local_60 = (char **)0x0;
    }
    else {
      local_60 = &local_38;
    }
    user._4_4_ = Curl_parse_login_details(option,len,local_50,local_60,(char **)0x0);
  }
  if (user._4_4_ == CURLE_OK) {
    if (passwdp_local != (char **)0x0) {
      if ((((passwd == (char *)0x0) && (userp_local != (char **)0x0)) &&
          (*(char *)userp_local == ':')) && (passwd = (*Curl_cstrdup)(""), passwd == (char *)0x0)) {
        user._4_4_ = CURLE_OUT_OF_MEMORY;
      }
      (*Curl_cfree)(*passwdp_local);
      *passwdp_local = (char *)0x0;
      *passwdp_local = passwd;
    }
    if (ppcStack_20 != (char **)0x0) {
      (*Curl_cfree)(*ppcStack_20);
      *ppcStack_20 = (char *)0x0;
      *ppcStack_20 = local_38;
    }
  }
  return user._4_4_;
}

Assistant:

static CURLcode setstropt_userpwd(char *option, char **userp, char **passwdp)
{
  CURLcode result = CURLE_OK;
  char *user = NULL;
  char *passwd = NULL;

  /* Parse the login details if specified. It not then we treat NULL as a hint
     to clear the existing data */
  if(option) {
    result = Curl_parse_login_details(option, strlen(option),
                                      (userp ? &user : NULL),
                                      (passwdp ? &passwd : NULL),
                                      NULL);
  }

  if(!result) {
    /* Store the username part of option if required */
    if(userp) {
      if(!user && option && option[0] == ':') {
        /* Allocate an empty string instead of returning NULL as user name */
        user = strdup("");
        if(!user)
          result = CURLE_OUT_OF_MEMORY;
      }

      Curl_safefree(*userp);
      *userp = user;
    }

    /* Store the password part of option if required */
    if(passwdp) {
      Curl_safefree(*passwdp);
      *passwdp = passwd;
    }
  }

  return result;
}